

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O3

bool operator<(cmLinkItem *l,cmLinkItem *r)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  byte extraout_var;
  
  pcVar1 = r->Target;
  if (l->Target == (cmGeneratorTarget *)0x0) {
    if (pcVar1 == (cmGeneratorTarget *)0x0) {
      std::__cxx11::string::compare((string *)l);
      bVar2 = (bool)(extraout_var >> 7);
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = l->Target < pcVar1 || pcVar1 == (cmGeneratorTarget *)0x0;
  }
  return bVar2;
}

Assistant:

bool operator<(cmLinkItem const& l, cmLinkItem const& r)
{
  // Order among targets.
  if (l.Target && r.Target) {
    return l.Target < r.Target;
  }
  // Order targets before strings.
  if (l.Target) {
    return true;
  }
  if (r.Target) {
    return false;
  }
  // Order among strings.
  return l.String < r.String;
}